

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::create_umac_grown(NavierStokesBase *this,int nGrow,MultiFab *a_divu)

{
  initializer_list<amrex::MultiFab_*> iVar1;
  initializer_list<double> iVar2;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> iVar3;
  initializer_list<double> iVar4;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> iVar5;
  initializer_list<double> iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  reference ppMVar15;
  NullInterpHook<amrex::FArrayBox> *pre_interp;
  NullInterpHook<amrex::FArrayBox> *post_interp;
  StateData *pSVar16;
  reference pvVar17;
  NavierStokesBase *pNVar18;
  long in_RDX;
  int in_ESI;
  MFIter *this_00;
  long in_RDI;
  Periodicity PVar19;
  Real tmp_2;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Real tmp_1;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Real tmp;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box bx2;
  Box bx1;
  Box bx0;
  Array4<double> *wmac;
  Array4<double> *vmac;
  Array4<double> *umac;
  Array4<const_double> *divu;
  Array4<const_double> foo;
  Array4<const_int> *maskarr;
  Box *bx;
  MFIter mfi;
  GpuArray<double,_3U> dxinv;
  GpuArray<double,_3U> dx;
  iMultiFab mask;
  int interior;
  int physbnd;
  int uncovered;
  int covered;
  Real fake_time_1;
  Array<StateDataPhysBCFunct,_3> cbndyFuncArr;
  Array<int,_3> bf_idx;
  StateDataPhysBCFunct crse_bndry_func_z;
  StateDataPhysBCFunct crse_bndry_func_y;
  StateDataPhysBCFunct crse_bndry_func_x;
  Array<int,_3> bc_idx;
  Array<Vector<BCRec>,_3> bcrecArr;
  Interpolater *mapper;
  Geometry *crse_geom;
  Array<MultiFab_*,_3> u_mac_crse;
  Real fake_time;
  int idim;
  Array<StateDataPhysBCFunct,_3> fbndyFuncArr;
  StateDataPhysBCFunct fine_bndry_func_z;
  StateDataPhysBCFunct fine_bndry_func_y;
  StateDataPhysBCFunct fine_bndry_func_x;
  Geometry *fine_geom;
  Array<MultiFab_*,_3> u_mac_fine;
  allocator_type *in_stack_ffffffffffffed48;
  MultiFab *pMVar20;
  NavierStokesBase *in_stack_ffffffffffffed50;
  MFIter *mfi_00;
  undefined4 in_stack_ffffffffffffed58;
  undefined4 uVar21;
  undefined4 in_stack_ffffffffffffed5c;
  undefined4 in_stack_ffffffffffffed60;
  undefined4 uVar22;
  undefined4 in_stack_ffffffffffffed64;
  undefined4 uVar23;
  MFInfo *info;
  undefined1 do_tiling_;
  ostream *in_stack_ffffffffffffed78;
  FabArrayBase *fabarray_;
  Print *in_stack_ffffffffffffed80;
  Geometry *this_01;
  FabArrayBase *bxs;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *factory;
  MFIter *this_02;
  undefined4 in_stack_ffffffffffffedc0;
  undefined4 in_stack_ffffffffffffedc4;
  double local_1238;
  double local_1228;
  double local_1218;
  Vector<double,_std::allocator<double>_> *in_stack_ffffffffffffee00;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *in_stack_ffffffffffffee08;
  Vector<double,_std::allocator<double>_> *in_stack_ffffffffffffee10;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *in_stack_ffffffffffffee18;
  Real in_stack_ffffffffffffee20;
  IntVect *in_stack_ffffffffffffee28;
  int in_stack_ffffffffffffee70;
  Geometry *cgeom;
  Geometry *fgeom;
  Array<amrex::StateDataPhysBCFunct,_3> *cbc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *cbccomp;
  Array<amrex::StateDataPhysBCFunct,_3> *in_stack_ffffffffffffeea8;
  Array<int,_3> *in_stack_ffffffffffffeeb0;
  IntVect *in_stack_ffffffffffffeeb8;
  Interpolater *in_stack_ffffffffffffeec0;
  Array<Vector<BCRec>,_3> *in_stack_ffffffffffffeec8;
  value_type bcscomp;
  int local_10fc;
  int local_10f8;
  int local_10f4;
  undefined8 in_stack_ffffffffffffef50;
  value_type physbnd_00;
  double dVar24;
  value_type in_stack_ffffffffffffef58;
  value_type in_stack_ffffffffffffef5c;
  int iVar25;
  undefined4 in_stack_ffffffffffffef60;
  int iVar26;
  int iVar27;
  undefined4 in_stack_ffffffffffffef64;
  Box *in_stack_ffffffffffffef68;
  undefined4 in_stack_ffffffffffffef70;
  undefined4 in_stack_ffffffffffffef74;
  int local_104c;
  int local_1048;
  int local_1044;
  int local_fe4;
  int local_fe0;
  int iStack_fdc;
  int iStack_fd8;
  int local_fd4;
  int iStack_fd0;
  int local_fac;
  int local_fa8;
  int iStack_fa4;
  int iStack_fa0;
  int local_f9c;
  int iStack_f98;
  int local_f90 [2];
  int local_f88;
  int local_f7c [2];
  int local_f74;
  int local_f70;
  int local_f6c;
  int iStack_f68;
  int iStack_f64;
  int local_f60;
  int iStack_f5c;
  undefined4 local_f54;
  long local_f50 [8];
  long *local_f10;
  long local_f08 [8];
  long *local_ec8;
  value_type in_stack_fffffffffffff140;
  undefined4 uStack_ebc;
  long local_eb8;
  long local_eb0;
  int local_ea0;
  int local_e9c;
  int local_e98;
  Array4 local_e78 [64];
  Array4 *local_e38;
  Array4<const_double> local_e30;
  long local_df0 [8];
  long *local_db0;
  Box local_da4;
  Box *local_d88;
  MFIter local_d80;
  GpuArray<double,_3U> local_d20;
  GpuArray<double,_3U> local_d08;
  IntVect local_cf0;
  undefined8 local_ce0;
  int local_cd8;
  _func_int **local_cd0;
  BATransformer local_cc8;
  int in_stack_fffffffffffff398;
  int in_stack_fffffffffffff39c;
  element_type *in_stack_fffffffffffff3a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff3a8;
  pointer in_stack_fffffffffffff3b0;
  IntVect *in_stack_fffffffffffff3b8;
  MultiFab *in_stack_fffffffffffff3c0;
  undefined1 local_b02 [82];
  undefined1 *local_ab0;
  undefined8 local_aa8;
  undefined8 local_a80;
  undefined8 *local_a78;
  undefined8 local_a70;
  undefined1 local_a48 [88];
  undefined8 local_9f0;
  StateData *local_9e8;
  Arena *pAStack_9e0;
  Geometry *local_9d8;
  StateData *local_9d0;
  pointer pbStack_9c8;
  Geometry *local_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined1 local_9a0 [40];
  StateDataPhysBCFunct local_978;
  StateDataPhysBCFunct local_960;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_948;
  undefined4 local_940;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_938;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_930 [4];
  _Bit_pointer local_8e8;
  Geometry *local_8e0;
  CoordSys local_8d8;
  value_type local_880;
  value_type *local_878;
  Real local_870;
  int in_stack_fffffffffffff7a0;
  Geometry *in_stack_fffffffffffff7a8;
  StateDataPhysBCFunct *in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7b8;
  float local_834;
  StateData *local_830;
  Real local_828;
  Geometry *local_820;
  StateData *local_818;
  Real local_810;
  Geometry *local_808;
  StateData *local_800;
  Real local_7f8;
  Geometry *local_7f0;
  undefined1 local_7e8 [16];
  Geometry *local_7d8;
  undefined1 local_7d0 [16];
  Geometry *local_7c0;
  undefined1 local_7b8 [16];
  Geometry *local_7a8;
  Geometry *local_7a0;
  double local_798;
  float afStack_790 [106];
  long local_5e8;
  int local_5dc;
  undefined4 *local_5d0;
  int local_5c8 [2];
  int local_5c0;
  undefined4 local_5b8;
  IntVect local_5b4 [2];
  undefined4 local_598;
  IntVect local_594;
  int local_588 [2];
  int local_580;
  undefined4 local_578;
  IntVect local_574 [2];
  int *local_558;
  int *local_530;
  int *local_508;
  int *local_4e0;
  int *local_4b8;
  int *local_490;
  int local_47c;
  int local_478;
  int local_474;
  long *local_470;
  int local_464;
  int local_460;
  int local_45c;
  long *local_458;
  int local_44c;
  int local_448;
  int local_444;
  long *local_440;
  int local_434;
  int local_430;
  int local_42c;
  Array4 *local_428;
  int local_41c;
  int local_418;
  int local_414;
  Array4 *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  Array4 *local_3f8;
  undefined4 local_3ec;
  GpuArray<double,_3U> *local_3e8;
  undefined4 local_3dc;
  GpuArray<double,_3U> *local_3d8;
  undefined4 local_3cc;
  GpuArray<double,_3U> *local_3c8;
  undefined4 local_3bc;
  GpuArray<double,_3U> *local_3b8;
  undefined4 local_3ac;
  GpuArray<double,_3U> *local_3a8;
  undefined4 local_39c;
  GpuArray<double,_3U> *local_398;
  undefined4 local_38c;
  GpuArray<double,_3U> *local_388;
  undefined4 local_37c;
  GpuArray<double,_3U> *local_378;
  undefined4 local_36c;
  GpuArray<double,_3U> *local_368;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  undefined1 *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  undefined1 *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  int local_26c;
  int local_268;
  int local_264;
  long *local_260;
  int local_254;
  int local_250;
  int local_24c;
  long *local_248;
  int local_23c;
  int local_238;
  int local_234;
  long *local_230;
  int local_224;
  int local_220;
  int local_21c;
  long *local_218;
  int local_20c;
  int local_208;
  int local_204;
  undefined1 *local_200;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  undefined1 *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  undefined1 *local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  undefined1 *local_1b8;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  undefined1 *local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  undefined1 *local_188;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  int local_164;
  int local_160;
  int local_15c;
  long *local_158;
  int local_14c;
  int local_148;
  int local_144;
  long *local_140;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  undefined4 local_11c;
  int *local_118;
  undefined4 local_10c;
  int *local_108;
  undefined4 local_fc;
  int *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  int *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  physbnd_00 = (value_type)((ulong)in_stack_ffffffffffffef50 >> 0x20);
  if (0 < in_ESI) {
    local_5e8 = in_RDX;
    local_5dc = in_ESI;
    if (1 < in_ESI) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffed50,(char (*) [119])in_stack_ffffffffffffed48);
      amrex::Print::~Print((Print *)CONCAT44(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0));
    }
    bcscomp = *(value_type *)(in_RDI + 0xb80);
    ppMVar15 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                         ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed50,
                          (size_type)in_stack_ffffffffffffed48);
    *ppMVar15 = bcscomp;
    pre_interp = (NullInterpHook<amrex::FArrayBox> *)(*(long *)(in_RDI + 0xb80) + 0x180);
    ppMVar15 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                         ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed50,
                          (size_type)in_stack_ffffffffffffed48);
    *ppMVar15 = (value_type)pre_interp;
    post_interp = (NullInterpHook<amrex::FArrayBox> *)(*(long *)(in_RDI + 0xb80) + 0x300);
    ppMVar15 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                         ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed50,
                          (size_type)in_stack_ffffffffffffed48);
    *ppMVar15 = (value_type)post_interp;
    local_7a0 = (Geometry *)(in_RDI + 0x10);
    pSVar16 = amrex::AmrLevel::get_state_data
                        (&in_stack_ffffffffffffed50->super_AmrLevel,
                         (int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              ((StateDataPhysBCFunct *)local_7b8,pSVar16,0,(Geometry *)(in_RDI + 0x10));
    pSVar16 = amrex::AmrLevel::get_state_data
                        (&in_stack_ffffffffffffed50->super_AmrLevel,
                         (int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              ((StateDataPhysBCFunct *)local_7d0,pSVar16,1,(Geometry *)(in_RDI + 0x10));
    pSVar16 = amrex::AmrLevel::get_state_data
                        (&in_stack_ffffffffffffed50->super_AmrLevel,
                         (int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              ((StateDataPhysBCFunct *)local_7e8,pSVar16,2,(Geometry *)(in_RDI + 0x10));
    local_830 = (StateData *)local_7b8._0_8_;
    local_828 = (Real)local_7b8._8_8_;
    local_820 = local_7a8;
    local_818 = (StateData *)local_7d0._0_8_;
    local_810 = (Real)local_7d0._8_8_;
    local_808 = local_7c0;
    local_800 = (StateData *)local_7e8._0_8_;
    local_7f8 = (Real)local_7e8._8_8_;
    local_7f0 = local_7d8;
    if (*(int *)(in_RDI + 8) == 0) {
      for (local_834 = 0.0; (int)local_834 < 3; local_834 = (float)((int)local_834 + 1)) {
        amrex::IntVect::IntVect((IntVect *)&stack0xfffffffffffff7b4,local_5dc);
        ppMVar15 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                             ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed50,
                              (size_type)in_stack_ffffffffffffed48);
        local_880 = *ppMVar15;
        local_878 = &local_880;
        local_870 = 4.94065645841247e-324;
        std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x7b6eb0);
        iVar1._M_array._4_4_ = in_stack_ffffffffffffed5c;
        iVar1._M_array._0_4_ = in_stack_ffffffffffffed58;
        iVar1._M_len._0_4_ = in_stack_ffffffffffffed60;
        iVar1._M_len._4_4_ = in_stack_ffffffffffffed64;
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   in_stack_ffffffffffffed50,iVar1,(allocator_type *)in_stack_ffffffffffffed48);
        local_8d8.dx[0] = 0.0;
        local_8d8.dx[1] = (Real)local_8d8.dx;
        local_8d8.dx[2] = 4.94065645841247e-324;
        std::allocator<double>::allocator((allocator<double> *)0x7b6f1a);
        iVar2._M_array._4_4_ = in_stack_ffffffffffffed5c;
        iVar2._M_array._0_4_ = in_stack_ffffffffffffed58;
        iVar2._M_len._0_4_ = in_stack_ffffffffffffed60;
        iVar2._M_len._4_4_ = in_stack_ffffffffffffed64;
        amrex::Vector<double,_std::allocator<double>_>::vector
                  ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed50,iVar2,
                   in_stack_ffffffffffffed48);
        pNVar18 = (NavierStokesBase *)(in_RDI + 0x10);
        pvVar17 = std::array<amrex::StateDataPhysBCFunct,_3UL>::operator[]
                            ((array<amrex::StateDataPhysBCFunct,_3UL> *)in_stack_ffffffffffffed50,
                             (size_type)in_stack_ffffffffffffed48);
        in_stack_ffffffffffffed50 = pNVar18;
        in_stack_ffffffffffffed58 = SUB84(pvVar17,0);
        in_stack_ffffffffffffed5c = (undefined4)((ulong)pvVar17 >> 0x20);
        in_stack_ffffffffffffed60 = 0;
        in_stack_ffffffffffffed48 =
             (allocator_type *)CONCAT44((int)((ulong)in_stack_ffffffffffffed48 >> 0x20),1);
        amrex::FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                  (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,
                   (Real)in_stack_fffffffffffff3b0,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   in_stack_fffffffffffff3a8._M_pi,
                   (Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff3a0,
                   in_stack_fffffffffffff39c,in_stack_fffffffffffff398,in_stack_fffffffffffff7a0,
                   in_stack_fffffffffffff7a8,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7b8);
        amrex::Vector<double,_std::allocator<double>_>::~Vector
                  ((Vector<double,_std::allocator<double>_> *)0x7b6fd0);
        std::allocator<double>::~allocator((allocator<double> *)0x7b6fdd);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x7b6fea);
        std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x7b6ff7);
      }
    }
    else {
      pNVar18 = getLevel(in_stack_ffffffffffffed50,(int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      pMVar20 = pNVar18->u_mac;
      fgeom = (Geometry *)&local_8d8;
      ppMVar15 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                           ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed50,
                            (size_type)in_stack_ffffffffffffed48);
      *ppMVar15 = pMVar20;
      pNVar18 = getLevel(in_stack_ffffffffffffed50,(int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      iVar25 = (int)pMVar20;
      cgeom = (Geometry *)(pNVar18->u_mac + 1);
      ppMVar15 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                           ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed50,
                            (size_type)in_stack_ffffffffffffed48);
      *ppMVar15 = (value_type)cgeom;
      pNVar18 = getLevel(in_stack_ffffffffffffed50,(int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      cbc = (Array<amrex::StateDataPhysBCFunct,_3> *)(pNVar18->u_mac + 2);
      ppMVar15 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                           ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffed50,
                            (size_type)in_stack_ffffffffffffed48);
      *ppMVar15 = (value_type)cbc;
      pNVar18 = getLevel(in_stack_ffffffffffffed50,(int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      local_8e0 = &(pNVar18->super_AmrLevel).geom;
      local_8e8 = &amrex::face_linear_interp;
      cbccomp = local_930;
      local_938._M_pi = cbccomp;
      amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
                ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffed50,
                 (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffed48);
      local_938._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&cbccomp[1]._M_use_count;
      amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
                ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffed50,
                 (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffed48);
      local_938._M_pi = cbccomp + 3;
      amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
                ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffed50,
                 (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffed48);
      local_948._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000000;
      local_940 = 2;
      pNVar18 = getLevel(in_stack_ffffffffffffed50,(int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      iVar13 = (int)pNVar18;
      pSVar16 = amrex::AmrLevel::get_state_data
                          (&in_stack_ffffffffffffed50->super_AmrLevel,
                           (int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct(&local_960,pSVar16,0,local_8e0);
      getLevel(in_stack_ffffffffffffed50,(int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      pSVar16 = amrex::AmrLevel::get_state_data
                          (&in_stack_ffffffffffffed50->super_AmrLevel,
                           (int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct(&local_978,pSVar16,1,local_8e0);
      getLevel(in_stack_ffffffffffffed50,(int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      pSVar16 = amrex::AmrLevel::get_state_data
                          (&in_stack_ffffffffffffed50->super_AmrLevel,
                           (int)((ulong)in_stack_ffffffffffffed48 >> 0x20));
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
                ((StateDataPhysBCFunct *)(local_9a0 + 0x10),pSVar16,2,local_8e0);
      local_9a0._8_4_ = null;
      local_9a0._0_8_ = (_func_int **)0x0;
      local_9d8 = local_960.geom;
      local_9e8 = local_960.statedata;
      pAStack_9e0 = (Arena *)local_960._8_8_;
      local_9c0 = local_978.geom;
      local_9d0 = local_978.statedata;
      pbStack_9c8 = (pointer)local_978._8_8_;
      local_9a8 = local_9a0._32_8_;
      local_9b8 = local_9a0._16_8_;
      uStack_9b0 = local_9a0._24_8_;
      local_9f0 = 0;
      amrex::IntVect::IntVect((IntVect *)(local_a48 + 0x4c),local_5dc);
      local_a48._16_8_ = local_8d8.offset[1];
      local_a48._0_8_ = local_8d8._0_8_;
      local_a48._8_8_ = local_8d8.offset[0];
      local_a48._32_8_ = local_a48;
      local_a48._40_8_ = 1;
      std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::allocator
                ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x7b7405);
      iVar3._M_array._4_4_ = in_stack_ffffffffffffed5c;
      iVar3._M_array._0_4_ = in_stack_ffffffffffffed58;
      iVar3._M_len._0_4_ = in_stack_ffffffffffffed60;
      iVar3._M_len._4_4_ = in_stack_ffffffffffffed64;
      amrex::
      Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)in_stack_ffffffffffffed50,iVar3,(allocator_type *)in_stack_ffffffffffffed48);
      local_a80 = local_9f0;
      local_a78 = &local_a80;
      local_a70 = 1;
      std::allocator<double>::allocator((allocator<double> *)0x7b746f);
      iVar4._M_array._4_4_ = in_stack_ffffffffffffed5c;
      iVar4._M_array._0_4_ = in_stack_ffffffffffffed58;
      iVar4._M_len._0_4_ = in_stack_ffffffffffffed60;
      iVar4._M_len._4_4_ = in_stack_ffffffffffffed64;
      amrex::Vector<double,_std::allocator<double>_>::vector
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed50,iVar4,
                 in_stack_ffffffffffffed48);
      local_b02._74_4_ = afStack_790[2];
      local_b02._78_4_ = afStack_790[3];
      local_b02._58_8_ = local_798;
      local_b02._66_4_ = afStack_790[0];
      local_b02._70_4_ = afStack_790[1];
      local_ab0 = local_b02 + 0x3a;
      local_aa8 = 1;
      std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::allocator
                ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x7b74e7);
      iVar5._M_array._4_4_ = in_stack_ffffffffffffed5c;
      iVar5._M_array._0_4_ = in_stack_ffffffffffffed58;
      iVar5._M_len._0_4_ = in_stack_ffffffffffffed60;
      iVar5._M_len._4_4_ = in_stack_ffffffffffffed64;
      amrex::
      Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)in_stack_ffffffffffffed50,iVar5,(allocator_type *)in_stack_ffffffffffffed48);
      local_b02._2_8_ = local_9f0;
      local_b02._10_8_ = local_b02 + 2;
      local_b02._18_8_ = 1;
      std::allocator<double>::allocator((allocator<double> *)0x7b7551);
      iVar6._M_array._4_4_ = in_stack_ffffffffffffed5c;
      iVar6._M_array._0_4_ = in_stack_ffffffffffffed58;
      iVar6._M_len._0_4_ = in_stack_ffffffffffffed60;
      iVar6._M_len._4_4_ = in_stack_ffffffffffffed64;
      amrex::Vector<double,_std::allocator<double>_>::vector
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed50,iVar6,
                 in_stack_ffffffffffffed48);
      this_00 = (MFIter *)(in_RDI + 0x158);
      this_02 = (MFIter *)local_b02;
      factory = local_930;
      fabarray_ = (FabArrayBase *)local_9a0;
      this_01 = (Geometry *)&local_830;
      info = (MFInfo *)&local_9e8;
      uVar22 = SUB84(local_8e0,0);
      uVar23 = (undefined4)((ulong)local_8e0 >> 0x20);
      uVar21 = 1;
      mfi_00 = (MFIter *)((ulong)in_stack_ffffffffffffed50 & 0xffffffff00000000);
      pMVar20 = (MultiFab *)((ulong)in_stack_ffffffffffffed48 & 0xffffffff00000000);
      bxs = fabarray_;
      amrex::
      FillPatchTwoLevels<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::Interpolater,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                ((Array<amrex::MultiFab_*,_3> *)&stack0xffffffffffffed48,in_stack_ffffffffffffee28,
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,
                 in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,in_stack_ffffffffffffee70,
                 iVar13,iVar25,cgeom,fgeom,cbc,(Array<int,_3> *)cbccomp,in_stack_ffffffffffffeea8,
                 in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeec0,
                 in_stack_ffffffffffffeec8,(Array<int,_3> *)bcscomp,pre_interp,post_interp);
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x7b7673);
      std::allocator<double>::~allocator((allocator<double> *)0x7b7680);
      amrex::
      Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::~Vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                 *)0x7b768d);
      std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::~allocator
                ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x7b769a);
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x7b76a7);
      std::allocator<double>::~allocator((allocator<double> *)0x7b76b4);
      amrex::
      Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::~Vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                 *)0x7b76c1);
      std::allocator<std::array<amrex::MultiFab_*,_3UL>_>::~allocator
                ((allocator<std::array<amrex::MultiFab_*,_3UL>_> *)0x7b76ce);
      ppMVar15 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                           ((array<amrex::MultiFab_*,_3UL> *)mfi_00,(size_type)pMVar20);
      amrex::FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar15);
      local_cc8.m_op._12_8_ = 0;
      local_cc8.m_op._20_8_ = 0;
      local_cc8._0_8_ = 0;
      local_cc8.m_op._4_8_ = 0;
      local_cc8.m_op._28_8_ = 0;
      amrex::MFInfo::MFInfo((MFInfo *)0x7b7765);
      local_cd0 = (_func_int **)0x0;
      pMVar20 = (MultiFab *)&local_cd0;
      amrex::DefaultFabFactory<amrex::IArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::IArrayBox> *)mfi_00);
      amrex::iMultiFab::iMultiFab
                ((iMultiFab *)this_00,(BoxArray *)bxs,(DistributionMapping *)this_01,
                 (int)((ulong)fabarray_ >> 0x20),(int)fabarray_,info,
                 (FabFactory<amrex::IArrayBox> *)factory);
      do_tiling_ = (undefined1)((ulong)info >> 0x38);
      amrex::DefaultFabFactory<amrex::IArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::IArrayBox> *)0x7b77d1);
      amrex::MFInfo::~MFInfo((MFInfo *)0x7b77de);
      amrex::Geometry::Domain(local_7a0);
      PVar19 = amrex::Geometry::periodicity(this_01);
      local_cf0.vect[2] = PVar19.period.vect[2];
      local_cd8 = local_cf0.vect[2];
      local_cf0.vect._0_8_ = PVar19.period.vect._0_8_;
      local_ce0._0_4_ = local_cf0.vect[0];
      local_ce0._4_4_ = local_cf0.vect[1];
      pMVar20 = (MultiFab *)((ulong)pMVar20 & 0xffffffff00000000);
      local_cf0 = PVar19.period.vect;
      amrex::FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
                 in_stack_ffffffffffffef68,
                 (Periodicity *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58,physbnd_00,
                 in_stack_fffffffffffff140);
      amrex::CoordSys::CellSizeArray(&local_d08,&local_7a0->super_CoordSys);
      amrex::CoordSys::InvCellSizeArray(&local_d20,&local_7a0->super_CoordSys);
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter((MFIter *)this_01,fabarray_,(bool)do_tiling_);
      while (bVar10 = amrex::MFIter::isValid(&local_d80), bVar10) {
        amrex::MFIter::tilebox(this_02);
        local_d88 = &local_da4;
        amrex::FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((FabArray<amrex::IArrayBox> *)CONCAT44(in_stack_ffffffffffffed5c,uVar21),mfi_00);
        local_db0 = local_df0;
        amrex::Array4<const_double>::Array4(&local_e30);
        if (local_5e8 == 0) {
          memcpy(local_e78,&local_e30,0x3c);
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_ffffffffffffed5c,uVar21),mfi_00
                    );
        }
        local_e38 = local_e78;
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)mfi_00,(size_type)pMVar20);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_ffffffffffffed5c,uVar21),mfi_00);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)mfi_00,(size_type)pMVar20);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_ffffffffffffed5c,uVar21),mfi_00);
        local_ec8 = local_f08;
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)mfi_00,(size_type)pMVar20);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_ffffffffffffed5c,uVar21),mfi_00);
        local_f10 = local_f50;
        local_f54 = 0;
        local_5d0 = &local_f54;
        local_578 = 0;
        amrex::IntVect::IntVect(local_574,1,0,0);
        local_580 = local_574[0].vect[2];
        local_588[0] = local_574[0].vect[0];
        local_588[1] = local_574[0].vect[1];
        local_f88 = local_574[0].vect[2];
        local_f90[0] = local_574[0].vect[0];
        local_f90[1] = local_574[0].vect[1];
        local_f7c[0] = local_574[0].vect[0];
        local_f7c[1] = local_574[0].vect[1];
        local_f74 = local_574[0].vect[2];
        amrex::MFIter::growntilebox(this_00,(IntVect *)bxs);
        local_598 = 1;
        amrex::IntVect::IntVect(&local_594,0,1,0);
        amrex::MFIter::growntilebox(this_00,(IntVect *)bxs);
        local_5b8 = 2;
        amrex::IntVect::IntVect(local_5b4,0,0,1);
        local_5c0 = local_5b4[0].vect[2];
        local_5c8[0] = local_5b4[0].vect[0];
        local_5c8[1] = local_5b4[0].vect[1];
        amrex::MFIter::growntilebox(this_00,(IntVect *)bxs);
        iVar26 = iStack_f5c;
        iVar12 = local_f60;
        iVar27 = iStack_f64;
        local_508 = &local_f70;
        local_6c = 0;
        iVar13 = local_f70;
        local_7c = 1;
        iVar25 = local_f6c;
        local_8c = 2;
        local_f8 = &iStack_f64;
        local_fc = 0;
        local_108 = &iStack_f64;
        local_10c = 1;
        local_118 = &iStack_f64;
        local_11c = 2;
        local_490 = local_508;
        local_88 = local_508;
        local_78 = local_508;
        local_68 = local_508;
        for (local_1044 = iStack_f68; iVar9 = iStack_f98, iVar8 = local_f9c, iVar7 = iStack_fa0,
            iVar14 = local_fa8, iVar11 = local_fac, local_1048 = iVar25, local_1044 <= iVar26;
            local_1044 = local_1044 + 1) {
          for (; local_104c = iVar13, local_1048 <= iVar12; local_1048 = local_1048 + 1) {
            for (; local_104c <= iVar27; local_104c = local_104c + 1) {
              bVar10 = amrex::Box::contains(local_d88,local_104c,local_1048,local_1044);
              if (!bVar10) {
                local_440 = local_db0;
                local_444 = local_104c;
                local_448 = local_1048;
                local_44c = local_1044;
                if (*(int *)(*local_db0 +
                            ((long)(local_104c - (int)local_db0[4]) +
                             (long)(local_1048 - *(int *)((long)local_db0 + 0x24)) * local_db0[1] +
                            (long)(local_1044 - (int)local_db0[5]) * local_db0[2]) * 4) == 1) {
                  bVar10 = amrex::Array4::operator_cast_to_bool(local_e38);
                  if (bVar10) {
                    local_3f8 = local_e38;
                    local_3fc = local_104c;
                    local_400 = local_1048;
                    local_404 = local_1044;
                    local_1218 = *(double *)
                                  (*(long *)local_e38 +
                                  ((long)(local_104c - *(int *)(local_e38 + 0x20)) +
                                   (long)(local_1048 - *(int *)(local_e38 + 0x24)) *
                                   *(long *)(local_e38 + 8) +
                                  (long)(local_1044 - *(int *)(local_e38 + 0x28)) *
                                  *(long *)(local_e38 + 0x10)) * 8);
                  }
                  else {
                    local_1218 = 0.0;
                  }
                  local_368 = &local_d08;
                  local_36c = 0;
                  local_378 = &local_d20;
                  local_37c = 1;
                  local_130 = local_1048 + 1;
                  local_128 = local_ec8;
                  local_12c = local_104c;
                  local_134 = local_1044;
                  local_140 = local_ec8;
                  local_144 = local_104c;
                  local_148 = local_1048;
                  local_14c = local_1044;
                  local_388 = &local_d20;
                  local_38c = 2;
                  local_164 = local_1044 + 1;
                  local_158 = local_f10;
                  local_15c = local_104c;
                  local_160 = local_1048;
                  local_170 = local_f10;
                  local_174 = local_104c;
                  local_178 = local_1048;
                  local_17c = local_1044;
                  dVar24 = local_d08.arr[0] *
                           ((local_d20.arr[1] *
                             (*(double *)
                               (*local_ec8 +
                               ((long)(local_104c - (int)local_ec8[4]) +
                                (long)(local_130 - *(int *)((long)local_ec8 + 0x24)) * local_ec8[1]
                               + (long)(local_1044 - (int)local_ec8[5]) * local_ec8[2]) * 8) -
                             *(double *)
                              (*local_ec8 +
                              ((long)(local_104c - (int)local_ec8[4]) +
                               (long)(local_1048 - *(int *)((long)local_ec8 + 0x24)) * local_ec8[1]
                              + (long)(local_1044 - (int)local_ec8[5]) * local_ec8[2]) * 8)) +
                            local_d20.arr[2] *
                            (*(double *)
                              (*local_f10 +
                              ((long)(local_104c - (int)local_f10[4]) +
                               (long)(local_1048 - *(int *)((long)local_f10 + 0x24)) * local_f10[1]
                              + (long)(local_164 - (int)local_f10[5]) * local_f10[2]) * 8) -
                            *(double *)
                             (*local_f10 +
                             ((long)(local_104c - (int)local_f10[4]) +
                              (long)(local_1048 - *(int *)((long)local_f10 + 0x24)) * local_f10[1] +
                             (long)(local_1044 - (int)local_f10[5]) * local_f10[2]) * 8))) -
                           local_1218);
                  iVar11 = amrex::Box::smallEnd(local_d88,0);
                  if (local_104c < iVar11) {
                    local_18c = local_104c + 1;
                    local_190 = local_1048;
                    local_194 = local_1044;
                    local_1a4 = local_104c;
                    local_1a8 = local_1048;
                    local_1ac = local_1044;
                    *(double *)
                     (CONCAT44(uStack_ebc,in_stack_fffffffffffff140) +
                     ((long)(local_104c - local_ea0) + (local_1048 - local_e9c) * local_eb8 +
                     (local_1044 - local_e98) * local_eb0) * 8) =
                         *(double *)
                          (CONCAT44(uStack_ebc,in_stack_fffffffffffff140) +
                          ((long)(local_18c - local_ea0) + (local_1048 - local_e9c) * local_eb8 +
                          (local_1044 - local_e98) * local_eb0) * 8) + dVar24;
                    local_1a0 = &stack0xfffffffffffff140;
                    local_188 = &stack0xfffffffffffff140;
                  }
                  else {
                    iVar11 = amrex::Box::bigEnd(local_d88,0);
                    if (iVar11 < local_104c) {
                      local_1bc = local_104c;
                      local_1c0 = local_1048;
                      local_1c4 = local_1044;
                      local_1d4 = local_104c + 1;
                      local_1d8 = local_1048;
                      local_1dc = local_1044;
                      *(double *)
                       (CONCAT44(uStack_ebc,in_stack_fffffffffffff140) +
                       ((long)(local_1d4 - local_ea0) + (local_1048 - local_e9c) * local_eb8 +
                       (local_1044 - local_e98) * local_eb0) * 8) =
                           *(double *)
                            (CONCAT44(uStack_ebc,in_stack_fffffffffffff140) +
                            ((long)(local_104c - local_ea0) + (local_1048 - local_e9c) * local_eb8 +
                            (local_1044 - local_e98) * local_eb0) * 8) - dVar24;
                      local_1d0 = &stack0xfffffffffffff140;
                      local_1b8 = &stack0xfffffffffffff140;
                    }
                  }
                }
              }
            }
          }
        }
        local_530 = &local_fac;
        local_3c = 0;
        local_4c = 1;
        local_5c = 2;
        local_c8 = &iStack_fa0;
        local_cc = 0;
        local_d8 = &iStack_fa0;
        local_dc = 1;
        local_e8 = &iStack_fa0;
        local_ec = 2;
        local_4b8 = local_530;
        local_58 = local_530;
        local_48 = local_530;
        local_38 = local_530;
        for (iVar13 = iStack_fa4; iVar12 = iStack_fd0, iVar27 = local_fd4, iVar25 = iStack_fd8,
            iVar26 = iVar14, iVar13 <= iVar9; iVar13 = iVar13 + 1) {
          for (; iVar25 = iVar11, iVar26 <= iVar8; iVar26 = iVar26 + 1) {
            for (; iVar25 <= iVar7; iVar25 = iVar25 + 1) {
              bVar10 = amrex::Box::contains(local_d88,iVar25,iVar26,iVar13);
              if ((!bVar10) &&
                 (local_458 = local_db0, local_464 = iVar13, local_460 = iVar26, local_45c = iVar25,
                 *(int *)(*local_db0 +
                         ((long)(iVar25 - (int)local_db0[4]) +
                          (long)(iVar26 - *(int *)((long)local_db0 + 0x24)) * local_db0[1] +
                         (long)(iVar13 - (int)local_db0[5]) * local_db0[2]) * 4) == 1)) {
                bVar10 = amrex::Array4::operator_cast_to_bool(local_e38);
                if (bVar10) {
                  local_410 = local_e38;
                  local_1228 = *(double *)
                                (*(long *)local_e38 +
                                ((long)(iVar25 - *(int *)(local_e38 + 0x20)) +
                                 (long)(iVar26 - *(int *)(local_e38 + 0x24)) *
                                 *(long *)(local_e38 + 8) +
                                (long)(iVar13 - *(int *)(local_e38 + 0x28)) *
                                *(long *)(local_e38 + 0x10)) * 8);
                  local_41c = iVar13;
                  local_418 = iVar26;
                  local_414 = iVar25;
                }
                else {
                  local_1228 = 0.0;
                }
                local_398 = &local_d08;
                local_39c = 1;
                local_3a8 = &local_d20;
                local_3ac = 0;
                local_1ec = iVar25 + 1;
                local_3b8 = &local_d20;
                local_3bc = 2;
                local_224 = iVar13 + 1;
                local_218 = local_f10;
                local_230 = local_f10;
                dVar24 = local_d08.arr[1] *
                         ((local_d20.arr[0] *
                           (*(double *)
                             (CONCAT44(uStack_ebc,in_stack_fffffffffffff140) +
                             ((long)(local_1ec - local_ea0) + (iVar26 - local_e9c) * local_eb8 +
                             (iVar13 - local_e98) * local_eb0) * 8) -
                           *(double *)
                            (CONCAT44(uStack_ebc,in_stack_fffffffffffff140) +
                            ((long)(iVar25 - local_ea0) + (iVar26 - local_e9c) * local_eb8 +
                            (iVar13 - local_e98) * local_eb0) * 8)) +
                          local_d20.arr[2] *
                          (*(double *)
                            (*local_f10 +
                            ((long)(iVar25 - (int)local_f10[4]) +
                             (long)(iVar26 - *(int *)((long)local_f10 + 0x24)) * local_f10[1] +
                            (long)(local_224 - (int)local_f10[5]) * local_f10[2]) * 8) -
                          *(double *)
                           (*local_f10 +
                           ((long)(iVar25 - (int)local_f10[4]) +
                            (long)(iVar26 - *(int *)((long)local_f10 + 0x24)) * local_f10[1] +
                           (long)(iVar13 - (int)local_f10[5]) * local_f10[2]) * 8))) - local_1228);
                iVar27 = iVar26;
                local_23c = iVar13;
                local_238 = iVar26;
                local_234 = iVar25;
                local_220 = iVar26;
                local_21c = iVar25;
                local_20c = iVar13;
                local_208 = iVar26;
                local_204 = iVar25;
                local_200 = &stack0xfffffffffffff140;
                local_1f4 = iVar13;
                local_1f0 = iVar26;
                local_1e8 = &stack0xfffffffffffff140;
                iVar12 = amrex::Box::smallEnd(local_d88,1);
                if (iVar26 < iVar12) {
                  local_250 = iVar27 + 1;
                  local_248 = local_ec8;
                  local_260 = local_ec8;
                  *(double *)
                   (*local_ec8 +
                   ((long)(iVar25 - (int)local_ec8[4]) +
                    (long)(iVar27 - *(int *)((long)local_ec8 + 0x24)) * local_ec8[1] +
                   (long)(iVar13 - (int)local_ec8[5]) * local_ec8[2]) * 8) =
                       *(double *)
                        (*local_ec8 +
                        ((long)(iVar25 - (int)local_ec8[4]) +
                         (long)(local_250 - *(int *)((long)local_ec8 + 0x24)) * local_ec8[1] +
                        (long)(iVar13 - (int)local_ec8[5]) * local_ec8[2]) * 8) + dVar24;
                  iVar26 = iVar27;
                  local_26c = iVar13;
                  local_268 = iVar27;
                  local_264 = iVar25;
                  local_254 = iVar13;
                  local_24c = iVar25;
                }
                else {
                  iVar26 = iVar27;
                  iVar12 = amrex::Box::bigEnd(local_d88,1);
                  if (iVar12 < iVar27) {
                    local_278 = local_ec8;
                    local_298 = iVar26 + 1;
                    local_290 = local_ec8;
                    *(double *)
                     (*local_ec8 +
                     ((long)(iVar25 - (int)local_ec8[4]) +
                      (long)(local_298 - *(int *)((long)local_ec8 + 0x24)) * local_ec8[1] +
                     (long)(iVar13 - (int)local_ec8[5]) * local_ec8[2]) * 8) =
                         *(double *)
                          (*local_ec8 +
                          ((long)(iVar25 - (int)local_ec8[4]) +
                           (long)(iVar26 - *(int *)((long)local_ec8 + 0x24)) * local_ec8[1] +
                          (long)(iVar13 - (int)local_ec8[5]) * local_ec8[2]) * 8) - dVar24;
                    local_29c = iVar13;
                    local_294 = iVar25;
                    local_284 = iVar13;
                    local_280 = iVar26;
                    local_27c = iVar25;
                  }
                }
              }
            }
          }
        }
        local_558 = &local_fe4;
        local_c = 0;
        iVar13 = local_fe4;
        local_1c = 1;
        iVar26 = local_fe0;
        local_2c = 2;
        local_98 = &iStack_fd8;
        local_9c = 0;
        local_a8 = &iStack_fd8;
        local_ac = 1;
        local_b8 = &iStack_fd8;
        local_bc = 2;
        local_4e0 = local_558;
        local_28 = local_558;
        local_18 = local_558;
        local_8 = local_558;
        for (local_10f4 = iStack_fdc; local_10f8 = iVar26, local_10f4 <= iVar12;
            local_10f4 = local_10f4 + 1) {
          for (; local_10fc = iVar13, local_10f8 <= iVar27; local_10f8 = local_10f8 + 1) {
            for (; local_10fc <= iVar25; local_10fc = local_10fc + 1) {
              bVar10 = amrex::Box::contains(local_d88,local_10fc,local_10f8,local_10f4);
              if (!bVar10) {
                local_470 = local_db0;
                local_474 = local_10fc;
                local_478 = local_10f8;
                local_47c = local_10f4;
                if (*(int *)(*local_db0 +
                            ((long)(local_10fc - (int)local_db0[4]) +
                             (long)(local_10f8 - *(int *)((long)local_db0 + 0x24)) * local_db0[1] +
                            (long)(local_10f4 - (int)local_db0[5]) * local_db0[2]) * 4) == 1) {
                  bVar10 = amrex::Array4::operator_cast_to_bool(local_e38);
                  if (bVar10) {
                    local_428 = local_e38;
                    local_42c = local_10fc;
                    local_430 = local_10f8;
                    local_434 = local_10f4;
                    local_1238 = *(double *)
                                  (*(long *)local_e38 +
                                  ((long)(local_10fc - *(int *)(local_e38 + 0x20)) +
                                   (long)(local_10f8 - *(int *)(local_e38 + 0x24)) *
                                   *(long *)(local_e38 + 8) +
                                  (long)(local_10f4 - *(int *)(local_e38 + 0x28)) *
                                  *(long *)(local_e38 + 0x10)) * 8);
                  }
                  else {
                    local_1238 = 0.0;
                  }
                  local_3c8 = &local_d08;
                  local_3cc = 2;
                  local_3d8 = &local_d20;
                  local_3dc = 1;
                  local_2b0 = local_10f8 + 1;
                  local_2a8 = local_ec8;
                  local_2ac = local_10fc;
                  local_2b4 = local_10f4;
                  local_2c0 = local_ec8;
                  local_2c4 = local_10fc;
                  local_2c8 = local_10f8;
                  local_2cc = local_10f4;
                  local_3e8 = &local_d20;
                  local_3ec = 0;
                  local_2dc = local_10fc + 1;
                  local_2e0 = local_10f8;
                  local_2e4 = local_10f4;
                  local_2f4 = local_10fc;
                  local_2f8 = local_10f8;
                  local_2fc = local_10f4;
                  dVar24 = local_d08.arr[2] *
                           ((local_d20.arr[1] *
                             (*(double *)
                               (*local_ec8 +
                               ((long)(local_10fc - (int)local_ec8[4]) +
                                (long)(local_2b0 - *(int *)((long)local_ec8 + 0x24)) * local_ec8[1]
                               + (long)(local_10f4 - (int)local_ec8[5]) * local_ec8[2]) * 8) -
                             *(double *)
                              (*local_ec8 +
                              ((long)(local_10fc - (int)local_ec8[4]) +
                               (long)(local_10f8 - *(int *)((long)local_ec8 + 0x24)) * local_ec8[1]
                              + (long)(local_10f4 - (int)local_ec8[5]) * local_ec8[2]) * 8)) +
                            local_d20.arr[0] *
                            (*(double *)
                              (CONCAT44(uStack_ebc,in_stack_fffffffffffff140) +
                              ((long)(local_2dc - local_ea0) + (local_10f8 - local_e9c) * local_eb8
                              + (local_10f4 - local_e98) * local_eb0) * 8) -
                            *(double *)
                             (CONCAT44(uStack_ebc,in_stack_fffffffffffff140) +
                             ((long)(local_10fc - local_ea0) + (local_10f8 - local_e9c) * local_eb8
                             + (local_10f4 - local_e98) * local_eb0) * 8))) - local_1238);
                  iVar11 = local_10f4;
                  local_2f0 = &stack0xfffffffffffff140;
                  local_2d8 = &stack0xfffffffffffff140;
                  iVar14 = amrex::Box::smallEnd(local_d88,2);
                  if (iVar11 < iVar14) {
                    local_314 = local_10f4 + 1;
                    local_308 = local_f10;
                    local_30c = local_10fc;
                    local_310 = local_10f8;
                    local_320 = local_f10;
                    local_324 = local_10fc;
                    local_328 = local_10f8;
                    local_32c = local_10f4;
                    *(double *)
                     (*local_f10 +
                     ((long)(local_10fc - (int)local_f10[4]) +
                      (long)(local_10f8 - *(int *)((long)local_f10 + 0x24)) * local_f10[1] +
                     (long)(local_10f4 - (int)local_f10[5]) * local_f10[2]) * 8) =
                         *(double *)
                          (*local_f10 +
                          ((long)(local_10fc - (int)local_f10[4]) +
                           (long)(local_10f8 - *(int *)((long)local_f10 + 0x24)) * local_f10[1] +
                          (long)(local_314 - (int)local_f10[5]) * local_f10[2]) * 8) + dVar24;
                  }
                  else {
                    iVar11 = local_10f4;
                    iVar14 = amrex::Box::bigEnd(local_d88,2);
                    if (iVar14 < iVar11) {
                      local_338 = local_f10;
                      local_33c = local_10fc;
                      local_340 = local_10f8;
                      local_344 = local_10f4;
                      local_35c = local_10f4 + 1;
                      local_350 = local_f10;
                      local_354 = local_10fc;
                      local_358 = local_10f8;
                      *(double *)
                       (*local_f10 +
                       ((long)(local_10fc - (int)local_f10[4]) +
                        (long)(local_10f8 - *(int *)((long)local_f10 + 0x24)) * local_f10[1] +
                       (long)(local_35c - (int)local_f10[5]) * local_f10[2]) * 8) =
                           *(double *)
                            (*local_f10 +
                            ((long)(local_10fc - (int)local_f10[4]) +
                             (long)(local_10f8 - *(int *)((long)local_f10 + 0x24)) * local_f10[1] +
                            (long)(local_10f4 - (int)local_f10[5]) * local_f10[2]) * 8) - dVar24;
                    }
                  }
                }
              }
            }
          }
        }
        amrex::MFIter::operator++(&local_d80);
      }
      amrex::MFIter::~MFIter(mfi_00);
      amrex::iMultiFab::~iMultiFab((iMultiFab *)0x7b9b40);
      std::array<amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,_3UL>::~array
                ((array<amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,_3UL> *)
                 CONCAT44(uVar23,uVar22));
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::create_umac_grown (int nGrow,
                                     const MultiFab* a_divu)
{
    if ( nGrow <= 0 ) { return; }
    if ( nGrow > 1 )  { Print()<<"\n\nWARNING!\n  NSB::create_umac_grown currently only enforces the divergnece constraint on 1 ghost cell, but nGrow > 1\n\n"; }


    Array<MultiFab*, AMREX_SPACEDIM> u_mac_fine;
    AMREX_D_TERM(u_mac_fine[0] = &u_mac[0];,
                 u_mac_fine[1] = &u_mac[1];,
                 u_mac_fine[2] = &u_mac[2];);

    Geometry *fine_geom = &geom;

    //Grab the velocity phys bc fill function from the StateData StateDescriptor
    AMREX_D_TERM(StateDataPhysBCFunct fine_bndry_func_x(get_state_data(State_Type),0,geom);,
                 StateDataPhysBCFunct fine_bndry_func_y(get_state_data(State_Type),1,geom);,
                 StateDataPhysBCFunct fine_bndry_func_z(get_state_data(State_Type),2,geom););

    Array<StateDataPhysBCFunct,AMREX_SPACEDIM> fbndyFuncArr = {AMREX_D_DECL(fine_bndry_func_x,
									    fine_bndry_func_y,
									    fine_bndry_func_z)};


    if ( level == 0 )
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            //
            // BDS needs physical BCs filled.
            // Godunov needs periodic ghosts filled (and handles physical BCs internally).
            //
            Real fake_time = 0.;
            amrex::FillPatchSingleLevel(u_mac[idim], IntVect(nGrow), fake_time,
                                        {u_mac_fine[idim]}, {fake_time},
                                        0, 0, 1, geom,
                                        fbndyFuncArr[idim], 0);
        }
    }
    else // level > 0
    {
        Array<MultiFab*, AMREX_SPACEDIM> u_mac_crse;
        AMREX_D_TERM(u_mac_crse[0] = &getLevel(level-1).u_mac[0];,
                     u_mac_crse[1] = &getLevel(level-1).u_mac[1];,
                     u_mac_crse[2] = &getLevel(level-1).u_mac[2];);

        Geometry *crse_geom = &getLevel(level-1).geom;

        //
        // First interpolate, ignoring divergence constraint. Then correct
        // the 1-cell wide halo of ghosts cells we need to enforce the
        // constraint.
        //

        // Divergence preserving interp -- This is for case of MAC solve on
        // composite grid; doesn't make sense to use it here.
        //Interpolater* mapper = &face_divfree_interp;
        // Use linear interpolation, which matches up with old create umac grown
        Interpolater* mapper = &face_linear_interp;

        // This never actually gets used because the FaceLinear Interpolator doesn't use it.
        // Inside FillPatchTwoLevels, it's only use is that it's passed to the interpolator.
        // Fill it with the correct thing anyway.
        Array<Vector<BCRec>,AMREX_SPACEDIM> bcrecArr = {AMREX_D_DECL(m_bcrec_velocity,
                                                                     m_bcrec_velocity,
                                                                     m_bcrec_velocity)};
        Array<int, AMREX_SPACEDIM> bc_idx = {AMREX_D_DECL(0,1,2)};

        // Grab the velocity phys bc fill function from the StateData StateDescriptor
        // This will use the BCRec for velocity stored in the StateDescriptor
        AMREX_D_TERM(
            StateDataPhysBCFunct crse_bndry_func_x(getLevel(level-1).get_state_data(State_Type),0,*crse_geom);,
            StateDataPhysBCFunct crse_bndry_func_y(getLevel(level-1).get_state_data(State_Type),1,*crse_geom);,
            StateDataPhysBCFunct crse_bndry_func_z(getLevel(level-1).get_state_data(State_Type),2,*crse_geom););
        Array<int, AMREX_SPACEDIM> bf_idx = {AMREX_D_DECL(0,0,0)};

        Array<StateDataPhysBCFunct,AMREX_SPACEDIM> cbndyFuncArr = {AMREX_D_DECL(crse_bndry_func_x,
										crse_bndry_func_y,
										crse_bndry_func_z)};

        // Use piecewise constant interpolation in time, so create ficticious variable for time
        Real fake_time = 0.;

        FillPatchTwoLevels(u_mac_fine, IntVect(nGrow), fake_time,
                           {u_mac_crse}, {fake_time},
                           {u_mac_fine}, {fake_time},
                           0, 0, 1,
                           *crse_geom, *fine_geom,
                           cbndyFuncArr, bf_idx, fbndyFuncArr, bf_idx,
                           crse_ratio, mapper, bcrecArr, bc_idx);

        //
        // Correct u_mac to enforce the divergence constraint in the ghost cells.
        // Do this by adjusting only the outer face (wrt the valid region) of the ghost
        // cell, i.e. for the hi-x face, adjust umac_x(i+1).
        // NOTE that this does not fill edges or corners.
        //

        // Build mask to find the ghost cells we need to correct.
        // covered   : ghost cells covered by valid cells of this FabArray
        //             (including periodically shifted valid cells)
        // notcovered: ghost cells not covered by valid cells
        //             (including ghost cells outside periodic boundaries)
        // physbnd   : boundary cells outside the domain (excluding periodic boundaries)
        // interior  : interior cells (i.e., valid cells)
        int covered   = 0;
        int uncovered = 1;
        int physbnd   = 0;
        int interior  = 0;
        iMultiFab mask(grids, u_mac_fine[0]->DistributionMap(), 1, 1, MFInfo(),
                       DefaultFabFactory<IArrayBox>());
        mask.BuildMask(fine_geom->Domain(), fine_geom->periodicity(),
                       covered, uncovered, physbnd, interior);

        const GpuArray<Real,AMREX_SPACEDIM> dx = fine_geom->CellSizeArray();
        const GpuArray<Real,AMREX_SPACEDIM> dxinv = fine_geom->InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto const& maskarr = mask.const_array(mfi);
            Array4<const Real> foo;
            auto const& divu = (a_divu) ? a_divu->const_array(mfi) : foo;
            AMREX_D_TERM(auto const& umac = u_mac_fine[0]->array(mfi);,
                         auto const& vmac = u_mac_fine[1]->array(mfi);,
                         auto const& wmac = u_mac_fine[2]->array(mfi));

            // Fuse the launches, 1 for each dimension, into a single launch.
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(RunOn::Gpu,
                mfi.growntilebox(IntVect::TheDimensionVector(0)), bx0,
                {
                    AMREX_LOOP_3D(bx0, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[0] * (   dxinv[1]*(vmac(i,j+1,k) - vmac(i,j,k))
#if (AMREX_SPACEDIM == 3)
                                             + dxinv[2]*(wmac(i,j,k+1) - wmac(i,j,k))
#endif
                                             - tmp );

                            if ( i < bx.smallEnd(0) )
                            {
                                umac(i,j,k) = umac(i+1,j,k) + tmp;
                            }
                            else if ( i > bx.bigEnd(0) )
                            {
                                umac(i+1,j,k) = umac(i,j,k) - tmp;
                            }
                        }
                    });
                },
                mfi.growntilebox(IntVect::TheDimensionVector(1)), bx1,
                {
                    AMREX_LOOP_3D(bx1, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[1] * (   dxinv[0]*(umac(i+1,j,k) - umac(i,j,k))
#if (AMREX_SPACEDIM == 3)
                                             + dxinv[2]*(wmac(i,j,k+1) - wmac(i,j,k))
#endif
                                             - tmp );

                            if ( j < bx.smallEnd(1) )
                            {
                                vmac(i,j,k) = vmac(i,j+1,k) + tmp;
                            }
                            else if ( j > bx.bigEnd(1) )
                            {
                                vmac(i,j+1,k) = vmac(i,j,k) - tmp;
                            }
                        }
                    });
                },
                mfi.growntilebox(IntVect::TheDimensionVector(2)), bx2,
                {
                    AMREX_LOOP_3D(bx2, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[2] * (   dxinv[1]*(vmac(i,j+1,k) - vmac(i,j,k))
                                             + dxinv[0]*(umac(i+1,j,k) - umac(i,j,k))
                                             - tmp );

                            if ( k < bx.smallEnd(2) )
                            {
                                wmac(i,j,k) = wmac(i,j,k+1) + tmp;
                            }
                            else if ( k > bx.bigEnd(2) )
                            {
                                wmac(i,j,k+1) = wmac(i,j,k) - tmp;
                            }
                        }
                    });
                });
        }
    }
}